

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O0

VkDescriptorSet * __thiscall
vkt::pipeline::multisample::MSInstanceSampleMaskPattern::createMSPassDescSet
          (MSInstanceSampleMaskPattern *this,ImageMSParams *imageMSParams,
          VkDescriptorSetLayout *descSetLayout)

{
  PtrData<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_> data;
  RefData<vk::Handle<(vk::HandleType)21>_> data_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data_01;
  Allocator *pAVar1;
  VkDevice pVVar2;
  DescriptorPoolBuilder *this_00;
  Handle<(vk::HandleType)21> *pHVar3;
  Buffer *pBVar4;
  Allocation *pAVar5;
  void *dst;
  VkDeviceSize offset;
  VkBuffer *pVVar6;
  Handle<(vk::HandleType)22> *pHVar7;
  DescriptorSetUpdateBuilder *this_01;
  MovePtr<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_> *this_02;
  Location local_1d0;
  VkDescriptorSet local_1c8;
  DescriptorSetUpdateBuilder local_1c0;
  deUint64 local_178;
  undefined1 local_170 [8];
  VkDescriptorBufferInfo descBufferInfo;
  DefaultDeleter<vkt::pipeline::Buffer> local_14d;
  deUint32 local_14c;
  PtrData<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_> local_148;
  PtrData<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_> *local_138;
  undefined1 local_128 [8];
  VkBufferCreateInfo bufferSampleMaskInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_e0;
  RefData<vk::Handle<(vk::HandleType)22>_> local_c0;
  DescriptorPoolBuilder local_90;
  Move<vk::Handle<(vk::HandleType)21>_> local_78;
  RefData<vk::Handle<(vk::HandleType)21>_> local_58;
  Allocator *local_38;
  Allocator *allocator;
  VkDevice device;
  DeviceInterface *deviceInterface;
  VkDescriptorSetLayout *descSetLayout_local;
  ImageMSParams *imageMSParams_local;
  MSInstanceSampleMaskPattern *this_local;
  
  deviceInterface = (DeviceInterface *)descSetLayout;
  descSetLayout_local = (VkDescriptorSetLayout *)imageMSParams;
  imageMSParams_local = (ImageMSParams *)this;
  device = (VkDevice)
           Context::getDeviceInterface
                     ((this->super_MSInstanceBaseResolveAndPerSampleFetch).
                      super_MultisampleInstanceBase.super_TestInstance.m_context);
  allocator = (Allocator *)
              Context::getDevice((this->super_MSInstanceBaseResolveAndPerSampleFetch).
                                 super_MultisampleInstanceBase.super_TestInstance.m_context);
  local_38 = Context::getDefaultAllocator
                       ((this->super_MSInstanceBaseResolveAndPerSampleFetch).
                        super_MultisampleInstanceBase.super_TestInstance.m_context);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&local_90);
  this_00 = ::vk::DescriptorPoolBuilder::addType(&local_90,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            (&local_78,this_00,(DeviceInterface *)device,(VkDevice)allocator,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_58,(Move *)&local_78);
  data_00.deleter.m_deviceIface = local_58.deleter.m_deviceIface;
  data_00.object.m_internal = local_58.object.m_internal;
  data_00.deleter.m_device = local_58.deleter.m_device;
  data_00.deleter.m_allocator = local_58.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
            (&this->m_descriptorPool,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_78);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder(&local_90);
  pVVar2 = device;
  pAVar1 = allocator;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                     (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  bufferSampleMaskInfo.pQueueFamilyIndices = (deUint32 *)deviceInterface->_vptr_DeviceInterface;
  makeDescriptorSet(&local_e0,(DeviceInterface *)pVVar2,(VkDevice)pAVar1,
                    (VkDescriptorPool)pHVar3->m_internal,
                    (VkDescriptorSetLayout)bufferSampleMaskInfo.pQueueFamilyIndices);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_c0,(Move *)&local_e0);
  data_01.deleter.m_deviceIface = local_c0.deleter.m_deviceIface;
  data_01.object.m_internal = local_c0.object.m_internal;
  data_01.deleter.m_device = local_c0.deleter.m_device;
  data_01.deleter.m_pool.m_internal = local_c0.deleter.m_pool.m_internal;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=(&this->m_descriptorSet,data_01)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_e0);
  makeBufferCreateInfo((VkBufferCreateInfo *)local_128,4,0x10);
  pBVar4 = (Buffer *)operator_new(0x30);
  local_14c = ::vk::MemoryRequirement::HostVisible.m_flags;
  pipeline::Buffer::Buffer
            (pBVar4,(DeviceInterface *)device,(VkDevice)allocator,local_38,
             (VkBufferCreateInfo *)local_128,::vk::MemoryRequirement::HostVisible);
  de::DefaultDeleter<vkt::pipeline::Buffer>::DefaultDeleter(&local_14d);
  de::details::MovePtr<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>::MovePtr()
  ;
  local_138 = de::details::MovePtr::operator_cast_to_PtrData(&local_148,(MovePtr *)pBVar4);
  data._8_8_ = local_c0.deleter.m_deviceIface;
  data.ptr = (Buffer *)local_c0.object.m_internal;
  de::details::MovePtr<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>::operator=
            (&this->m_buffer,data);
  de::details::MovePtr<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>::~MovePtr
            ((MovePtr<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_> *)
             &local_148);
  this_02 = &this->m_buffer;
  pBVar4 = de::details::
           UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>::operator->
                     (&this_02->
                       super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>
                     );
  pAVar5 = pipeline::Buffer::getAllocation(pBVar4);
  dst = ::vk::Allocation::getHostPtr(pAVar5);
  ::deMemcpy(dst,&(this->super_MSInstanceBaseResolveAndPerSampleFetch).super_MultisampleInstanceBase
                  .field_0x2c,4);
  pVVar2 = device;
  pAVar1 = allocator;
  pBVar4 = de::details::
           UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>::operator->
                     (&this_02->
                       super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>
                     );
  pAVar5 = pipeline::Buffer::getAllocation(pBVar4);
  descBufferInfo.range = (VkDeviceSize)::vk::Allocation::getMemory(pAVar5);
  pBVar4 = de::details::
           UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>::operator->
                     (&this_02->
                       super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>
                     );
  pAVar5 = pipeline::Buffer::getAllocation(pBVar4);
  offset = ::vk::Allocation::getOffset(pAVar5);
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)pVVar2,(VkDevice)pAVar1,(VkDeviceMemory)descBufferInfo.range,offset,
             0xffffffffffffffff);
  pBVar4 = de::details::
           UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>::operator*
                     (&this_02->
                       super_UniqueBase<vkt::pipeline::Buffer,_de::DefaultDeleter<vkt::pipeline::Buffer>_>
                     );
  pVVar6 = pipeline::Buffer::operator*(pBVar4);
  local_178 = pVVar6->m_internal;
  ::vk::makeDescriptorBufferInfo((VkDescriptorBufferInfo *)local_170,(VkBuffer)local_178,0,4);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_1c0);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                     (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  local_1c8.m_internal = pHVar7->m_internal;
  local_1d0 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  this_01 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_1c0,local_1c8,&local_1d0,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                       (VkDescriptorBufferInfo *)local_170);
  ::vk::DescriptorSetUpdateBuilder::update(this_01,(DeviceInterface *)device,(VkDevice)allocator);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_1c0);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                     (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  return pHVar7;
}

Assistant:

const VkDescriptorSet* MSInstanceSampleMaskPattern::createMSPassDescSet (const ImageMSParams& imageMSParams, const VkDescriptorSetLayout* descSetLayout)
{
	DE_UNREF(imageMSParams);

	const DeviceInterface&		deviceInterface = m_context.getDeviceInterface();
	const VkDevice				device			= m_context.getDevice();
	Allocator&					allocator		= m_context.getDefaultAllocator();

	// Create descriptor pool
	m_descriptorPool = DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, 1u)
		.build(deviceInterface, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

	// Create descriptor set
	m_descriptorSet = makeDescriptorSet(deviceInterface, device, *m_descriptorPool, *descSetLayout);

	const VkBufferCreateInfo bufferSampleMaskInfo = makeBufferCreateInfo(sizeof(VkSampleMask), VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT);

	m_buffer = de::MovePtr<Buffer>(new Buffer(deviceInterface, device, allocator, bufferSampleMaskInfo, MemoryRequirement::HostVisible));

	deMemcpy(m_buffer->getAllocation().getHostPtr(), &m_sampleMask, sizeof(VkSampleMask));

	flushMappedMemoryRange(deviceInterface, device, m_buffer->getAllocation().getMemory(), m_buffer->getAllocation().getOffset(), VK_WHOLE_SIZE);

	const VkDescriptorBufferInfo descBufferInfo = makeDescriptorBufferInfo(**m_buffer, 0u, sizeof(VkSampleMask));

	DescriptorSetUpdateBuilder()
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &descBufferInfo)
		.update(deviceInterface, device);

	return &m_descriptorSet.get();
}